

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O3

void deqp::gles31::Functional::anon_unknown_1::generateInternalFormatTextureGenerationGroup
               (vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
                *group,GLenum target)

{
  deUint32 internalFormat;
  bool bVar1;
  int iVar2;
  long *plVar3;
  TextureFormat TVar4;
  long *plVar5;
  size_type *psVar6;
  long lVar7;
  TextureLevelSpec level;
  TextureLevelSpec level_1;
  string local_138;
  ChannelType local_114;
  undefined1 local_110 [56];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  value_type local_98;
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  *local_78;
  uint local_70;
  uint local_6c;
  string local_68;
  code *local_40;
  GLenum local_38;
  
  local_114 = 0x8518;
  if (target != 0x8513) {
    local_114 = target;
  }
  local_d8._M_p = (pointer)&local_c8;
  local_110._20_4_ = 0x100;
  local_110[0x18] = false;
  local_110._32_8_ = (pointer)0x0;
  local_110._40_8_ = (pointer)0x0;
  local_110._48_8_ = (pointer)0x0;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_110._4_4_ = local_114;
  local_110._0_4_ = target;
  local_110[8] = true;
  local_110[9] = true;
  local_110._12_4_ = 0;
  local_110._16_4_ = 0;
  local_68._M_dataplus._M_p = (pointer)glu::getTextureTargetName;
  local_78 = group;
  local_68._M_string_length._0_4_ = target;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_138,&local_68);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
    local_b8 = (long *)*plVar3;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(local_78,(value_type *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_110._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._32_8_,local_110._48_8_ - local_110._32_8_);
  }
  local_70 = target & 0xfffffffd;
  local_6c = (uint)(local_70 == 0x9100);
  lVar7 = 0;
  do {
    internalFormat =
         *(deUint32 *)((long)generateInternalFormatTextureGenerationGroup::internalFormats + lVar7);
    TVar4 = glu::mapGLInternalFormat(internalFormat);
    if (target == 0x806f) {
      if ((TVar4.order != D) && (TVar4.order != DS)) goto LAB_014e67a6;
    }
    else if (local_70 == 0x9100) {
      if ((int)internalFormat < 0x88f0) {
        if (((internalFormat - 0x8229 < 0x14) &&
            ((0xfff05U >> (internalFormat - 0x8229 & 0x1f) & 1) != 0)) ||
           (((internalFormat - 0x8051 < 9 && ((0x1e1U >> (internalFormat - 0x8051 & 0x1f) & 1) != 0)
             ) || (internalFormat - 0x81a5 < 2)))) goto LAB_014e67a6;
      }
      else if ((int)internalFormat < 0x8d62) {
        if (((internalFormat - 0x8cac < 2) || (internalFormat == 0x88f0)) ||
           (internalFormat == 0x8c43)) goto LAB_014e67a6;
      }
      else if (((internalFormat - 0x8d62 < 0x2d) &&
               ((0x104104104001U >> ((ulong)(internalFormat - 0x8d62) & 0x3f) & 1) != 0)) ||
              (internalFormat == 0x906f)) {
LAB_014e67a6:
        if ((int)internalFormat < 0x8814) {
          if (((internalFormat - 0x8229 < 0x14) &&
              ((0xffff5U >> (internalFormat - 0x8229 & 0x1f) & 1) != 0)) ||
             (internalFormat == 0x8058)) {
LAB_014e6807:
            local_110._0_8_ = glu::mapGLInternalFormat(internalFormat);
            iVar2 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_110);
            local_110._16_4_ = 0;
            local_110._20_4_ = 0x100;
            local_110[0x18] = false;
            local_110._48_8_ = (pointer)0x0;
            local_110._32_8_ = (pointer)0x0;
            local_110._40_8_ = (pointer)0x0;
            local_d8._M_p = (pointer)&local_c8;
            local_d0 = 0;
            local_c8._M_local_buf[0] = '\0';
            local_98.width = 0;
            local_98.height = 0;
            local_98.depth = 0;
            local_98.level = 0;
            local_98.internalFormat = 0x1908;
            local_98.compressed = false;
            local_110._4_4_ = local_114;
            local_110[8] = true;
            local_110[9] = true;
            local_110._12_4_ = local_6c;
            local_40 = glu::getTextureTargetName;
            local_38 = target;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_68,&local_40);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_68);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            psVar6 = (size_type *)(plVar3 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar3 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar6) {
              local_138.field_2._M_allocated_capacity = *psVar6;
              local_138.field_2._8_8_ = plVar3[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *psVar6;
              local_138._M_dataplus._M_p = (pointer)*plVar3;
            }
            local_138._M_string_length = plVar3[1];
            *plVar3 = (long)psVar6;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            glu::getTextureFormatName(internalFormat);
            plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
            plVar5 = plVar3 + 2;
            if ((long *)*plVar3 == plVar5) {
              local_a8 = *plVar5;
              lStack_a0 = plVar3[3];
              local_b8 = &local_a8;
            }
            else {
              local_a8 = *plVar5;
              local_b8 = (long *)*plVar3;
            }
            local_b0 = plVar3[1];
            *plVar3 = (long)plVar5;
            plVar3[1] = 0;
            *(undefined1 *)(plVar3 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
            if (local_b8 != &local_a8) {
              operator_delete(local_b8,local_a8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,
                              CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                                       local_68.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if (target == 0x8c2a) {
              local_110._16_4_ = 0;
              local_110._20_4_ = iVar2 * 0x21 + -1;
              local_110[0x18] = true;
              local_98.width = 0x20;
              local_98.height = 1;
              local_98.depth = 1;
            }
            else {
              local_98.width = 0x20;
              bVar1 = textureTypeHasHeight(target);
              local_98.depth = 1;
              iVar2 = 1;
              if (bVar1) {
                iVar2 = 0x20;
              }
              local_98.height = iVar2;
              if ((int)target < 0x9009) {
                if ((target == 0x806f) || (target == 0x8c1a)) {
LAB_014e6a7e:
                  local_98.depth = 6;
                }
              }
              else if ((target == 0x9009) || (target == 0x9102)) goto LAB_014e6a7e;
            }
            local_98.level = 0;
            local_98.compressed = false;
            local_98.internalFormat = internalFormat;
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
            ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
                         *)(local_110 + 0x20),&local_98);
            std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
            ::push_back(local_78,(value_type *)local_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_p != &local_c8) {
              operator_delete(local_d8._M_p,
                              CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]
                                      ) + 1);
            }
            if ((pointer)local_110._32_8_ != (pointer)0x0) {
              operator_delete((void *)local_110._32_8_,local_110._48_8_ - local_110._32_8_);
            }
          }
        }
        else if (((internalFormat - 0x8d70 < 0x1f) &&
                 ((0x410c1043U >> (internalFormat - 0x8d70 & 0x1f) & 1) != 0)) ||
                ((internalFormat - 0x8814 < 7 &&
                 ((0x43U >> (internalFormat - 0x8814 & 0x1f) & 1) != 0)))) goto LAB_014e6807;
      }
    }
    else if (target != 0x8c2a) goto LAB_014e67a6;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0xd8);
  if (target == 0x8c2a) {
    return;
  }
  if (target == 0x9100) {
    return;
  }
  if (target == 0x9102) {
    return;
  }
  local_110._12_4_ = 0;
  local_110._16_4_ = 0;
  local_110._20_4_ = 0x100;
  local_110[0x18] = false;
  local_110._32_8_ = (pointer)0x0;
  local_110._40_8_ = (pointer)0x0;
  local_110._48_8_ = (pointer)0x0;
  local_d8._M_p = (pointer)&local_c8;
  local_d0 = 0;
  local_c8._M_local_buf[0] = '\0';
  local_110[8] = false;
  local_110[9] = true;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length._0_4_ = 0;
  local_68._M_string_length._4_4_ = 0;
  local_68.field_2._M_allocated_capacity._0_4_ = 0x1908;
  local_68.field_2._M_allocated_capacity._4_4_ =
       local_68.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_110._4_4_ = local_114;
  local_98._0_8_ = glu::getTextureTargetName;
  local_98.depth = target;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_138,&local_98);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_138);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_a8 = *plVar5;
    lStack_a0 = plVar3[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *plVar5;
    local_b8 = (long *)*plVar3;
  }
  local_b0 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_b8);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_68._M_dataplus._M_p = (pointer)0x2000000020;
  local_68._M_string_length._0_4_ = 1;
  if ((int)target < 0x9009) {
    if ((target != 0x806f) && (target != 0x8c1a)) goto LAB_014e6c9e;
  }
  else if ((target != 0x9009) && (target != 0x9102)) goto LAB_014e6c9e;
  local_68._M_string_length._0_4_ = 6;
LAB_014e6c9e:
  local_68._M_string_length._4_4_ = 3;
  local_68.field_2._M_allocated_capacity._0_4_ = 0x8058;
  local_68.field_2._M_allocated_capacity._4_4_ =
       local_68.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ::push_back((vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
               *)(local_110 + 0x20),(value_type *)&local_68);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(local_78,(value_type *)local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_p != &local_c8) {
    operator_delete(local_d8._M_p,
                    CONCAT71(local_c8._M_allocated_capacity._1_7_,local_c8._M_local_buf[0]) + 1);
  }
  if ((pointer)local_110._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_110._32_8_,local_110._48_8_ - local_110._32_8_);
  }
  return;
}

Assistant:

static void generateInternalFormatTextureGenerationGroup (std::vector<TextureGenerationSpec>& group, glw::GLenum target)
{
	const glw::GLenum queryTarget = (target == GL_TEXTURE_CUBE_MAP) ? (GL_TEXTURE_CUBE_MAP_NEGATIVE_Y) : (target);

	// Internal formats
	static const glw::GLenum internalFormats[] =
	{
		GL_R8, GL_R8_SNORM, GL_RG8, GL_RG8_SNORM, GL_RGB8, GL_RGB8_SNORM, GL_RGB565, GL_RGBA4, GL_RGB5_A1,
		GL_RGBA8, GL_RGBA8_SNORM, GL_RGB10_A2, GL_RGB10_A2UI, GL_SRGB8, GL_SRGB8_ALPHA8, GL_R16F, GL_RG16F,
		GL_RGB16F, GL_RGBA16F, GL_R32F, GL_RG32F, GL_RGB32F, GL_RGBA32F, GL_R11F_G11F_B10F, GL_RGB9_E5, GL_R8I,
		GL_R8UI, GL_R16I, GL_R16UI, GL_R32I, GL_R32UI, GL_RG8I, GL_RG8UI, GL_RG16I, GL_RG16UI, GL_RG32I, GL_RG32UI,
		GL_RGB8I, GL_RGB8UI, GL_RGB16I, GL_RGB16UI, GL_RGB32I, GL_RGB32UI, GL_RGBA8I, GL_RGBA8UI, GL_RGBA16I,
		GL_RGBA16UI, GL_RGBA32I, GL_RGBA32UI,

		GL_DEPTH_COMPONENT32F, GL_DEPTH_COMPONENT24, GL_DEPTH_COMPONENT16,
		GL_DEPTH32F_STENCIL8, GL_DEPTH24_STENCIL8
	};

	// initial
	{
		TextureGenerationSpec texGen;
		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= 0;
		texGen.fixedSamplePos	= true;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", initial values";

		group.push_back(texGen);
	}

	// test all formats
	for (int internalFormatNdx = 0; internalFormatNdx < DE_LENGTH_OF_ARRAY(internalFormats); ++internalFormatNdx)
	{
		if (!isLegalFormatForTarget(target, internalFormats[internalFormatNdx]))
			continue;

		const int								baseSize = getPixelSize(internalFormats[internalFormatNdx]);
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= true;
		texGen.sampleCount		= (isMultisampleTarget(target) ? (1) : (0));
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", internal format " + glu::getTextureFormatName(internalFormats[internalFormatNdx]);

		if (target == GL_TEXTURE_BUFFER)
		{
			texGen.texBufferDataOffset	= 0;
			texGen.texBufferDataSize	= 32 * baseSize + (baseSize - 1);
			texGen.bindWholeArray		= true;
		}

		level.width				= 32;
		level.height			= (textureTypeHasHeight(target)) ? (32) : (1);
		level.depth				= (textureTypeHasDepth(target)) ? (6) : (1);
		level.level				= 0;
		level.internalFormat	= internalFormats[internalFormatNdx];
		level.compressed		= false;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}

	// test mutable rgba8 with mip level 3
	if (targetSupportsMipLevels(target))
	{
		TextureGenerationSpec					texGen;
		TextureGenerationSpec::TextureLevelSpec	level;

		texGen.bindTarget		= target;
		texGen.queryTarget		= queryTarget;
		texGen.immutable		= false;
		texGen.description		= glu::getTextureTargetStr(target).toString() + ", internal format GL_RGBA8, mip level 3";

		level.width				= 32;
		level.height			= 32;
		level.depth				= (textureTypeHasDepth(target)) ? (6) : (1);
		level.level				= 3;
		level.internalFormat	= GL_RGBA8;
		level.compressed		= false;

		texGen.levels.push_back(level);
		group.push_back(texGen);
	}
}